

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# config_reader.c
# Opt level: O2

void config_perror(char *spec)

{
  perr(spec);
  perr("\n");
  (*(code *)(&DAT_00105164 + *(int *)(&DAT_00105164 + (ulong)errnum * 4)))();
  return;
}

Assistant:

void config_perror(const char * spec)
{
	perr(spec);
	perr("\n");
	switch (errnum)
	{
	case CONFIG_ERROR_VOID:
		break;
	case CONFIG_ERROR_CANNOT_ACCESS_CONFIG_FILE:
		perror(_("Can not access configuration file"));
		break;
	case CONFIG_ERROR_PARSE:
		perr(_("Configuration file parse error"));
		break;
	case CONFIG_ERROR_NO_PROPERTY:
		perr(_("Invalid property"));
		break;
	case CONFIG_ERROR_INVALID_DICT_TYPE:
		perr(_("Invalid dictionary type"));
		break;
	default:
		perr(_("Unknown"));
	}
}